

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::LE_Detonation_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_Detonation_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_330;
  KString local_310;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LE_Detonation_PDU *local_18;
  LE_Detonation_PDU *this_local;
  
  local_18 = this;
  this_local = (LE_Detonation_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  LE_Header::GetAsString_abi_cxx11_(&local_1c0,&this->super_LE_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-LE Detonation PDU-\n");
  poVar1 = std::operator<<(poVar1,"Optional Field Flags:\n");
  poVar1 = std::operator<<(poVar1,"\tTarget ID:                            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tMunition ID:                          ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tMunition Site & Application Included: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tEvent Site & Application Included:    ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tWarhead & Fuse Included:              ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 4 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tQuantity & Rate Included:             ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 5 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLocation In Entity Coordinates:       ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->m_DetonationFlag1Union).m_ui8Flag >> 6 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tFlag 2:                               ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(ushort)((this->m_DetonationFlag1Union).m_ui8Flag >> 7));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') {
    poVar1 = std::operator<<(local_190,"\tMunition Orientation: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->m_DetonationFlag2Union).m_ui8Flag & 1);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\tEvent Number: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->m_DetonationFlag2Union).m_ui8Flag >> 1 & 1);
    std::operator<<(poVar1,"\n");
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Target ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_TargetID);
    std::operator<<(poVar1,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 2 & 1) != 0) {
    poVar1 = std::operator<<(local_190,"Munition ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_MunitionID);
    std::operator<<(poVar1,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  if ((((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') &&
      (((this->m_DetonationFlag2Union).m_ui8Flag >> 1 & 1) != 0)) ||
     (((this->m_DetonationFlag1Union).m_ui8Flag >> 3 & 1) != 0)) {
    poVar1 = std::operator<<(local_190,"Event ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_EventID);
    std::operator<<(poVar1,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
  }
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_(&local_250,&this->m_MunitionDesc);
  std::operator<<(local_190,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  if (((this->m_DetonationFlag1Union).m_ui8Flag >> 6 & 1) == 0) {
    poVar1 = std::operator<<(local_190,"Location(World Coordinates):\n");
    DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_2b0,&this->m_LocWrldCoord);
    UTILS::IndentString(&local_290,&local_2b0,1,'\t');
    std::operator<<(poVar1,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  else {
    poVar1 = std::operator<<(local_190,"Location(Entity Coordinates): ");
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              (&local_270,&this->m_LocEntCoord);
    std::operator<<(poVar1,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  poVar1 = std::operator<<(local_190,"Velocity: ");
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_2d0,&this->m_Vel);
  std::operator<<(poVar1,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') &&
     (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0)) {
    poVar1 = std::operator<<(local_190,"Munition Orienation: ");
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_(&local_2f0,&this->m_Ori);
    std::operator<<(poVar1,(string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_(&local_310,&this->m_MunitionDesc);
  poVar1 = std::operator<<(local_190,(string *)&local_310);
  DATA_TYPE::ENUMS::GetEnumAsStringDetonationResult_abi_cxx11_
            (&local_330,(ENUMS *)(ulong)this->m_ui8DetonationResult,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_330);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Detonation_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Detonation PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_DetonationFlag1Union.m_ui8TargetId        << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionId      << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionSiteApp << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_DetonationFlag1Union.m_ui8EventSiteAppId  << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_DetonationFlag1Union.m_ui8WarheadFuse     << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_DetonationFlag1Union.m_ui8QuantRate       << "\n"
       << "\tLocation In Entity Coordinates:       " << ( KUINT16 )m_DetonationFlag1Union.m_ui8LocationTyp     << "\n"
       << "\tFlag 2:                               " << ( KUINT16 )m_DetonationFlag1Union.m_ui8Flag2           << "\n";
    
    if (m_DetonationFlag1Union.m_ui8Flag2)
    {
        ss << "\tMunition Orientation: " << (KUINT16)m_DetonationFlag2Union.m_ui8MunitionOri << "\n"
           << "\tEvent Number: " << (KUINT16)m_DetonationFlag2Union.m_ui8EventNum            << "\n";
    }

    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    if( ( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8EventNum ) || m_DetonationFlag1Union.m_ui8EventSiteAppId )
    {
        ss << "Event ID: " << m_EventID.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString();

    if( m_DetonationFlag1Union.m_ui8LocationTyp )
    {
        ss << "Location(Entity Coordinates): " << m_LocEntCoord.GetAsString();
    }
    else
    {
        ss << "Location(World Coordinates):\n" << IndentString( m_LocWrldCoord.GetAsString(), 1 );
    }

    ss << "Velocity: " << m_Vel.GetAsString();

    if( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        ss << "Munition Orienation: " << m_Ori.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString()
       << GetEnumAsStringDetonationResult( m_ui8DetonationResult )
       << "\n";

    return ss.str();
}